

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall leveldb::BlockHandle::EncodeTo(BlockHandle *this,string *dst)

{
  long lVar1;
  string *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == -1) {
    __assert_fail("offset_ != ~static_cast<uint64_t>(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/format.cc"
                  ,0x11,"void leveldb::BlockHandle::EncodeTo(std::string *) const");
  }
  if (in_RDI[1] != -1) {
    PutVarint64(in_RSI,(uint64_t)in_RDI);
    PutVarint64(in_RSI,(uint64_t)in_RDI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("size_ != ~static_cast<uint64_t>(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/format.cc"
                ,0x12,"void leveldb::BlockHandle::EncodeTo(std::string *) const");
}

Assistant:

void BlockHandle::EncodeTo(std::string* dst) const {
  // Sanity check that all fields have been set
  assert(offset_ != ~static_cast<uint64_t>(0));
  assert(size_ != ~static_cast<uint64_t>(0));
  PutVarint64(dst, offset_);
  PutVarint64(dst, size_);
}